

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_16ac71::SharedLibraryShellCommand::getShortDescription
          (SharedLibraryShellCommand *this,SmallVectorImpl<char> *result)

{
  StringRef Str;
  raw_svector_ostream rStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((this->super_ExternalCommand).description._M_string_length == 0) {
    llvm::raw_svector_ostream::raw_svector_ostream(&rStack_68,result);
    std::operator+(&local_38,"Creating Shared library: ",&this->sharedLibName);
    llvm::raw_ostream::operator<<((raw_ostream *)&rStack_68,&local_38);
    std::__cxx11::string::_M_dispose();
  }
  else {
    llvm::raw_svector_ostream::raw_svector_ostream(&rStack_68,result);
    Str.Data = (this->super_ExternalCommand).description._M_dataplus._M_p;
    Str.Length = (this->super_ExternalCommand).description._M_string_length;
    llvm::raw_ostream::operator<<((raw_ostream *)&rStack_68,Str);
  }
  llvm::raw_ostream::~raw_ostream((raw_ostream *)&rStack_68);
  return;
}

Assistant:

virtual void
  getShortDescription(SmallVectorImpl<char>& result) const override {
    if (getDescription().empty()) {
      llvm::raw_svector_ostream(result)
          << "Creating Shared library: " + sharedLibName;
    } else {
      llvm::raw_svector_ostream(result) << getDescription();
    }
  }